

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O2

void __thiscall
testing::Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::Matcher
          (Matcher<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> *this,
          pair<phmap::priv::hash_internal::EnumClass,_int> *value)

{
  MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&> MStack_38;
  EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_> local_20;
  
  (this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).vtable_ =
       (VTable *)0x0;
  (this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).buffer_.
  ptr = (void *)0x0;
  (this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002d7638;
  local_20.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>,_std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::equal_to<void>_>
  .rhs_.first = value->first;
  local_20.
  super_ComparisonBase<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>,_std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::equal_to<void>_>
  .rhs_.second = value->second;
  Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&>::
  Matcher<testing::internal::EqMatcher<std::pair<phmap::priv::hash_internal::EnumClass,int>>,void>
            ((Matcher<std::pair<phmap::priv::hash_internal::EnumClass,int>const&> *)&MStack_38,
             &local_20);
  internal::MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::operator=
            (&this->super_MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>
             ,&MStack_38);
  internal::MatcherBase<const_std::pair<phmap::priv::hash_internal::EnumClass,_int>_&>::~MatcherBase
            (&MStack_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}